

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall BasicBlock::InsertAfter(BasicBlock *this,Instr *newInstr)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  long lVar4;
  undefined4 *puVar5;
  Func **ppFVar6;
  long lVar7;
  
  pBVar1 = this->next;
  ppFVar6 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar6 = &this->func;
  }
  lVar7 = 0x18;
  lVar4 = lVar7;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar4 = 0xd0;
  }
  bVar3 = IR::Instr::HasFallThrough(*(Instr **)((long)&(*ppFVar6)->m_alloc + lVar4));
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xdb2,"(this->GetLastInstr()->HasFallThrough())",
                       "this->GetLastInstr()->HasFallThrough()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  ppFVar6 = (Func **)&this->next->firstInstr;
  if (this->next == (BasicBlock *)0x0) {
    lVar7 = 0xd0;
    ppFVar6 = &this->func;
  }
  IR::Instr::InsertAfter(*(Instr **)((long)&(*ppFVar6)->m_alloc + lVar7),newInstr);
  return;
}

Assistant:

void
BasicBlock::InsertAfter(IR::Instr *newInstr)
{
    Assert(this->GetLastInstr()->HasFallThrough());
    this->GetLastInstr()->InsertAfter(newInstr);
    this->SetLastInstr(newInstr);
}